

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

void XXH3_scrambleAcc_sse2(void *acc,void *secret)

{
  ulong *puVar1;
  long *plVar2;
  long in_RSI;
  long in_RDI;
  ulong uVar3;
  ulong uVar4;
  size_t i;
  __m128i prime32;
  __m128i *xsecret;
  __m128i *xacc;
  ulong local_160;
  __m128i prod_hi;
  __m128i prod_lo;
  __m128i data_key_hi;
  __m128i data_key;
  __m128i key_vec;
  __m128i data_vec;
  __m128i shifted;
  __m128i acc_vec;
  
  for (local_160 = 0; local_160 < 4; local_160 = local_160 + 1) {
    puVar1 = (ulong *)(in_RDI + local_160 * 0x10);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    puVar1 = (ulong *)(in_RSI + local_160 * 0x10);
    uVar3 = uVar3 ^ uVar3 >> 0x2f ^ *puVar1;
    uVar4 = uVar4 ^ uVar4 >> 0x2f ^ puVar1[1];
    plVar2 = (long *)(in_RDI + local_160 * 0x10);
    *plVar2 = (uVar3 & 0xffffffff) * 0x9e3779b1 + ((uVar3 >> 0x20) * 0x9e3779b1 << 0x20);
    plVar2[1] = (uVar4 & 0xffffffff) * 0x9e3779b1 + (uVar4 >> 0x20) * 0x9e3779b1;
  }
  return;
}

Assistant:

XXH_FORCE_INLINE XXH_TARGET_SSE2 void XXH3_scrambleAcc_sse2(
    void* XXH_RESTRICT acc, const void* XXH_RESTRICT secret) {
  XXH_ASSERT((((size_t)acc) & 15) == 0);
  {
    XXH_ALIGN(16) __m128i* const xacc = (__m128i*)acc;
    /* Unaligned. This is mainly for pointer arithmetic, and because
     * _mm_loadu_si128 requires a const __m128i * pointer for some reason. */
    const __m128i* const xsecret = (const __m128i*)secret;
    const __m128i prime32 = _mm_set1_epi32((int)XXH_PRIME32_1);

    size_t i;
    for (i = 0; i < XXH_STRIPE_LEN / sizeof(__m128i); i++) {
      /* xacc[i] ^= (xacc[i] >> 47) */
      __m128i const acc_vec = xacc[i];
      __m128i const shifted = _mm_srli_epi64(acc_vec, 47);
      __m128i const data_vec = _mm_xor_si128(acc_vec, shifted);
      /* xacc[i] ^= xsecret[i]; */
      __m128i const key_vec = _mm_loadu_si128(xsecret + i);
      __m128i const data_key = _mm_xor_si128(data_vec, key_vec);

      /* xacc[i] *= XXH_PRIME32_1; */
      __m128i const data_key_hi =
          _mm_shuffle_epi32(data_key, _MM_SHUFFLE(0, 3, 0, 1));
      __m128i const prod_lo = _mm_mul_epu32(data_key, prime32);
      __m128i const prod_hi = _mm_mul_epu32(data_key_hi, prime32);
      xacc[i] = _mm_add_epi64(prod_lo, _mm_slli_epi64(prod_hi, 32));
    }
  }
}